

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_path_leaflist_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  lysc_node *plVar1;
  bool bVar2;
  int iVar3;
  lyd_node *__s;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  ulong size;
  LY_ERR LVar7;
  
  LVar7 = LY_SUCCESS;
  if (node == (lyd_node *)0x0) {
LAB_00123792:
    __s = (lyd_node *)0x0;
  }
  else {
    plVar1 = node->schema;
    if (plVar1 == (lysc_node *)0x0) {
      __s = node[1].prev;
    }
    else {
      if ((plVar1->nodetype & 0xc) == 0) goto LAB_00123792;
      __s = *(lyd_node **)(node + 1);
      if (__s == (lyd_node *)0x0) {
        __s = (lyd_node *)lyd_value_get_canonical(plVar1->module->ctx,(lyd_value *)(node + 1));
      }
    }
  }
  sVar4 = strlen((char *)__s);
  size = sVar4 + *bufused + 7;
  bVar2 = true;
  if (*buflen < size) {
    if (is_static == '\0') {
      pcVar5 = (char *)ly_realloc(*buffer,size);
      *buffer = pcVar5;
      LVar7 = LY_SUCCESS;
      if (pcVar5 != (char *)0x0) {
        *buflen = size;
        goto LAB_001237e7;
      }
      LVar7 = LY_EMEM;
    }
    else {
      LVar7 = LY_EINCOMPLETE;
    }
    bVar2 = false;
  }
LAB_001237e7:
  if (bVar2) {
    pcVar5 = strchr((char *)__s,0x27);
    uVar6 = (uint)(pcVar5 == (char *)0x0) * 5 + 0x22;
    LVar7 = LY_SUCCESS;
    iVar3 = sprintf(*buffer + *bufused,"[.=%c%s%c]",(ulong)uVar6,__s,(ulong)uVar6);
    *bufused = *bufused + (long)iVar3;
  }
  return LVar7;
}

Assistant:

static LY_ERR
lyd_path_leaflist_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    size_t len;
    const char *val;
    char quot;

    val = lyd_get_value(node);
    len = 4 + strlen(val) + 2; /* "[.='" + val + "']" */
    LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

    quot = '\'';
    if (strchr(val, '\'')) {
        quot = '"';
    }
    *bufused += sprintf(*buffer + *bufused, "[.=%c%s%c]", quot, val, quot);

    return LY_SUCCESS;
}